

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_id_range(REF_CELL ref_cell,REF_MPI ref_mpi,REF_INT *min_id,REF_INT *max_id)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  int iVar4;
  REF_INT global;
  REF_INT nodes [27];
  REF_INT local_b4;
  REF_MPI local_b0;
  REF_INT local_a8 [30];
  
  *min_id = 0x7fffffff;
  *max_id = -0x80000000;
  if (ref_cell->last_node_is_an_id == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x43c,
           "ref_cell_id_range","cell does not have ids");
    uVar2 = 1;
  }
  else {
    iVar4 = ref_cell->max;
    local_b0 = ref_mpi;
    if (0 < iVar4) {
      cell = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar1 == 0) {
          iVar4 = local_a8[ref_cell->node_per];
          if (*min_id < local_a8[ref_cell->node_per]) {
            iVar4 = *min_id;
          }
          *min_id = iVar4;
          iVar4 = local_a8[ref_cell->node_per];
          if (local_a8[ref_cell->node_per] < *max_id) {
            iVar4 = *max_id;
          }
          *max_id = iVar4;
          iVar4 = ref_cell->max;
        }
        cell = cell + 1;
      } while (cell < iVar4);
    }
    ref_mpi_00 = local_b0;
    uVar2 = 0;
    if ((local_b0 != (REF_MPI)0x0) && (1 < local_b0->n)) {
      uVar2 = ref_mpi_min(local_b0,min_id,&local_b4,1);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_bcast(ref_mpi_00,&local_b4,1,1);
        if (uVar2 == 0) {
          *min_id = local_b4;
          uVar2 = ref_mpi_max(ref_mpi_00,max_id,&local_b4,1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x44a,"ref_cell_id_range",(ulong)uVar2,"mpi max face");
            return uVar2;
          }
          uVar2 = ref_mpi_bcast(ref_mpi_00,&local_b4,1,1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   1099,"ref_cell_id_range",(ulong)uVar2,"mpi max face");
            return uVar2;
          }
          *max_id = local_b4;
          return 0;
        }
        uVar3 = 0x447;
      }
      else {
        uVar3 = 0x446;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar3,
             "ref_cell_id_range",(ulong)uVar2,"mpi min face");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_range(REF_CELL ref_cell, REF_MPI ref_mpi,
                                     REF_INT *min_id, REF_INT *max_id) {
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_id = REF_INT_MAX;
  *max_id = REF_INT_MIN;

  RAS(ref_cell_last_node_is_an_id(ref_cell), "cell does not have ids");

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_id = MIN(*min_id, nodes[ref_cell_id_index(ref_cell)]);
    *max_id = MAX(*max_id, nodes[ref_cell_id_index(ref_cell)]);
  }